

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void reindexTable(Parse *pParse,Table *pTab,char *zColl)

{
  byte bVar1;
  byte bVar2;
  Index *pIndex;
  Schema *pSVar3;
  Schema **ppSVar4;
  int iDb;
  ulong uVar5;
  long lVar6;
  
  if (pTab->eTabType != '\x01') {
    for (pIndex = pTab->pIndex; pIndex != (Index *)0x0; pIndex = pIndex->pNext) {
      if (zColl == (char *)0x0) {
LAB_001b509a:
        if (pTab->pSchema == (Schema *)0x0) {
          iDb = -0x8000;
        }
        else {
          iDb = -1;
          ppSVar4 = &pParse->db->aDb->pSchema;
          do {
            iDb = iDb + 1;
            pSVar3 = *ppSVar4;
            ppSVar4 = ppSVar4 + 4;
          } while (pSVar3 != pTab->pSchema);
        }
        sqlite3BeginWriteOperation(pParse,0,iDb);
        sqlite3RefillIndex(pParse,pIndex,-1);
      }
      else if ((ulong)pIndex->nColumn != 0) {
        uVar5 = 0;
LAB_001b5054:
        if (-1 < pIndex->aiColumn[uVar5]) {
          lVar6 = 0;
          do {
            bVar1 = pIndex->azColl[uVar5][lVar6];
            bVar2 = zColl[lVar6];
            if (bVar1 == bVar2) {
              if ((ulong)bVar1 == 0) goto LAB_001b508b;
            }
            else if (""[bVar1] != ""[bVar2]) goto LAB_001b508b;
            lVar6 = lVar6 + 1;
          } while( true );
        }
        goto LAB_001b5090;
      }
LAB_001b50e2:
    }
  }
  return;
LAB_001b508b:
  if (bVar1 == bVar2) goto LAB_001b509a;
LAB_001b5090:
  uVar5 = uVar5 + 1;
  if (uVar5 == pIndex->nColumn) goto LAB_001b50e2;
  goto LAB_001b5054;
}

Assistant:

static void reindexTable(Parse *pParse, Table *pTab, char const *zColl){
  if( !IsVirtual(pTab) ){
    Index *pIndex;              /* An index associated with pTab */

    for(pIndex=pTab->pIndex; pIndex; pIndex=pIndex->pNext){
      if( zColl==0 || collationMatch(zColl, pIndex) ){
        int iDb = sqlite3SchemaToIndex(pParse->db, pTab->pSchema);
        sqlite3BeginWriteOperation(pParse, 0, iDb);
        sqlite3RefillIndex(pParse, pIndex, -1);
      }
    }
  }
}